

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O2

shared_ptr<duckdb::RowVersionManager,_true>
duckdb::RowVersionManager::Deserialize
          (MetaBlockPointer delete_pointer,MetadataManager *manager,idx_t start)

{
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> _Var1;
  RowVersionManager *pRVar2;
  unsigned_long uVar3;
  unsigned_long params;
  reference pvVar4;
  IOException *this;
  MetadataManager *extraout_RDX;
  element_type *this_00;
  bool bVar5;
  shared_ptr<duckdb::RowVersionManager,_true> sVar6;
  MetaBlockPointer pointer;
  allocator local_c9;
  idx_t start_local;
  string local_c0;
  MetadataReader source;
  
  this_00 = (element_type *)delete_pointer.block_pointer;
  if (delete_pointer._8_8_ == 0xffffffffffffffff) {
    (this_00->version_lock).super___mutex_base._M_mutex.__align = 0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(this_00->version_lock).super___mutex_base._M_mutex + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    make_shared_ptr<duckdb::RowVersionManager,unsigned_long&>((unsigned_long *)this_00);
    pRVar2 = shared_ptr<duckdb::RowVersionManager,_true>::operator->
                       ((shared_ptr<duckdb::RowVersionManager,_true> *)this_00);
    pointer._8_8_ = manager;
    pointer.block_pointer = delete_pointer._8_8_;
    MetadataReader::MetadataReader
              (&source,(MetadataManager *)start,pointer,
               (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)
               &pRVar2->storage_pointers,EXISTING_BLOCKS);
    uVar3 = ReadStream::Read<unsigned_long>(&source.super_ReadStream);
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      params = ReadStream::Read<unsigned_long>(&source.super_ReadStream);
      if ((params & 0x1ffffffff80000) != 0) {
        this = (IOException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_c0,
                   "In DeserializeDeletes, vector_index %llu is out of range for the max row group size of %llu. Corrupted file?"
                   ,&local_c9);
        IOException::IOException<unsigned_long,unsigned_long>(this,&local_c0,params,0x40000000);
        __cxa_throw(this,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pRVar2 = shared_ptr<duckdb::RowVersionManager,_true>::operator->
                         ((shared_ptr<duckdb::RowVersionManager,_true> *)this_00);
      FillVectorInfo(pRVar2,params);
      ChunkInfo::Read((ChunkInfo *)&local_c0,&source.super_ReadStream);
      pRVar2 = shared_ptr<duckdb::RowVersionManager,_true>::operator->
                         ((shared_ptr<duckdb::RowVersionManager,_true> *)this_00);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
               ::get<true>(&pRVar2->vector_info,params);
      _Var1._M_head_impl =
           (pvVar4->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
           _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>
           .super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
      (pvVar4->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t.
      super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
      super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl =
           (ChunkInfo *)local_c0._M_dataplus._M_p;
      if (_Var1._M_head_impl != (ChunkInfo *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_ChunkInfo + 8))();
      }
    }
    pRVar2 = shared_ptr<duckdb::RowVersionManager,_true>::operator->
                       ((shared_ptr<duckdb::RowVersionManager,_true> *)this_00);
    pRVar2->has_changes = false;
    MetadataReader::~MetadataReader(&source);
    manager = extraout_RDX;
  }
  sVar6.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)manager;
  sVar6.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_00;
  return (shared_ptr<duckdb::RowVersionManager,_true>)
         sVar6.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowVersionManager> RowVersionManager::Deserialize(MetaBlockPointer delete_pointer, MetadataManager &manager,
                                                             idx_t start) {
	if (!delete_pointer.IsValid()) {
		return nullptr;
	}
	auto version_info = make_shared_ptr<RowVersionManager>(start);
	MetadataReader source(manager, delete_pointer, &version_info->storage_pointers);
	auto chunk_count = source.Read<idx_t>();
	D_ASSERT(chunk_count > 0);
	for (idx_t i = 0; i < chunk_count; i++) {
		idx_t vector_index = source.Read<idx_t>();
		if (vector_index * STANDARD_VECTOR_SIZE >= Storage::MAX_ROW_GROUP_SIZE) {
			throw IOException("In DeserializeDeletes, vector_index %llu is out of range for the max row group size of "
			                  "%llu. Corrupted file?",
			                  vector_index, Storage::MAX_ROW_GROUP_SIZE);
		}

		version_info->FillVectorInfo(vector_index);
		version_info->vector_info[vector_index] = ChunkInfo::Read(source);
	}
	version_info->has_changes = false;
	return version_info;
}